

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstring.cpp
# Opt level: O3

void __thiscall TPZString::TPZString(TPZString *this,char *source)

{
  size_t sVar1;
  
  TPZStack<char,_10>::TPZStack(&this->super_TPZStack<char,_10>);
  (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01813d18;
  sVar1 = strlen(source);
  TPZManVector<char,_10>::Resize((TPZManVector<char,_10> *)this,sVar1 + 1);
  strncpy((this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore,
          source,(this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
                 fNElements);
  (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore[sVar1] =
       '\0';
  return;
}

Assistant:

TPZString::TPZString(char const * source)
{
	size_t len = strlen(source);
	Resize(len + 1);
	strncpy(fStore, source, NElements());
	
	// although the TPZStack class already stores the length, the null
	// character is necessary to export string as a null character
	// ended string
	fStore[len] = '\0';
}